

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::handleMousePress(Slider *this,Button button,Vector2f *mouseParent)

{
  undefined8 in_RDX;
  int in_ESI;
  Widget *in_RDI;
  Vector2f VVar1;
  Vector2f mouseLocal;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float fVar2;
  Widget *in_stack_ffffffffffffffe0;
  float thumbPosition;
  undefined4 in_stack_fffffffffffffff0;
  
  thumbPosition = (float)((ulong)in_RDX >> 0x20);
  Widget::handleMousePress
            (in_stack_ffffffffffffffe0,(Button)((ulong)in_RDI >> 0x20),
             (Vector2f *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  VVar1 = Widget::toLocalOriginSpace
                    (in_RDI,(Vector2f *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((in_ESI == 0) &&
     (((ulong)in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_right & 1) == 0)) {
    fVar2 = VVar1.x;
    Widget::getOrigin((Widget *)0x28c48a);
    updateThumb((Slider *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),thumbPosition);
    *(undefined1 *)
     &in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = 1;
    Widget::requestRedraw((Widget *)CONCAT44(fVar2,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void Slider::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && !isDragging_) {
        updateThumb(mouseLocal.x + getOrigin().x);
        isDragging_ = true;
        requestRedraw();
    }
}